

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateStaticVariableInitializers
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Descriptor *pDVar5;
  long *plVar6;
  char *pcVar7;
  Descriptor *in_RDX;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *pDVar8;
  size_t sVar9;
  int index;
  bool bVar10;
  string_view text;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8;
  undefined1 local_c8 [40];
  undefined1 local_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> local_68;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_48;
  
  local_c8._0_8_ = 0;
  local_c8._8_8_ = 0;
  local_c8._16_8_ = google::protobuf::internal::TypeCardToString_abi_cxx11_;
  UniqueFileScopeIdentifier_abi_cxx11_
            ((string *)local_a0,(java *)(this->super_MessageGenerator).descriptor_,in_RDX);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[11]>(&local_e8,local_c8,(char (*) [11])0x491568);
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
  pDVar5 = (Descriptor *)(local_a0 + 0x10);
  if ((Descriptor *)local_a0._0_8_ != pDVar5) {
    operator_delete((void *)local_a0._0_8_,local_90[0]._M_allocated_capacity + 1);
  }
  pDVar8 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar8 + 0x18) == 0) {
    plVar6 = (long *)(*(long *)(pDVar8 + 0x10) + 0x60);
  }
  else {
    plVar6 = (long *)(*(long *)(pDVar8 + 0x18) + 0x48);
  }
  lVar4 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                    ((int)((ulong)((long)pDVar8 - *plVar6) >> 3) * 0x286bca1b,(char *)pDVar5);
  local_a0._0_8_ = lVar4 - (long)pDVar5;
  local_e8.first.ctrl_ = &local_e8.second;
  local_a0._8_8_ = pDVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,pDVar5,lVar4);
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[6]>(&local_48,local_c8,(char (*) [6])0x34aa72);
  std::__cxx11::string::operator=
            ((string *)((long)local_48.first.field_1.slot_ + 0x10),(string *)&local_e8);
  if ((bool *)local_e8.first.ctrl_ != &local_e8.second) {
    operator_delete(local_e8.first.ctrl_,local_e8._16_8_ + 1);
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)local_a0,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true
            );
  absl::lts_20240722::container_internal::
  raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>(&local_e8,local_c8,(char (*) [10])0x4712c9);
  std::__cxx11::string::operator=
            ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
  pDVar8 = extraout_RDX;
  if ((Descriptor *)local_a0._0_8_ != pDVar5) {
    operator_delete((void *)local_a0._0_8_,local_90[0]._M_allocated_capacity + 1);
    pDVar8 = extraout_RDX_00;
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (*(long *)(pDVar1 + 0x18) != 0) {
    UniqueFileScopeIdentifier_abi_cxx11_((string *)local_a0,*(java **)(pDVar1 + 0x18),pDVar8);
    absl::lts_20240722::container_internal::
    raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
    ::try_emplace_impl<char_const(&)[7]>(&local_e8,local_c8,(char (*) [7])"parent");
    std::__cxx11::string::operator=
              ((string *)((long)local_e8.first.field_1.slot_ + 0x10),(string *)local_a0);
    if ((Descriptor *)local_a0._0_8_ != pDVar5) {
      operator_delete((void *)local_a0._0_8_,local_90[0]._M_allocated_capacity + 1);
    }
  }
  bVar10 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x18) == 0;
  sVar9 = 0x61;
  if (bVar10) {
    sVar9 = 0x55;
  }
  pcVar7 = 
  "internal_$identifier$_descriptor =\n  internal_$parent$_descriptor.getNestedTypes().get($index$);\n"
  ;
  if (bVar10) {
    pcVar7 = 
    "internal_$identifier$_descriptor =\n  getDescriptor().getMessageTypes().get($index$);\n";
  }
  text._M_str = pcVar7;
  text._M_len = sVar9;
  io::Printer::
  Print<absl::lts_20240722::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_c8,text);
  iVar2 = GenerateFieldAccessorTableInitializer(this,printer);
  iVar2 = iVar2 + 0x1e;
  pDVar5 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar5 + 0x80)) {
    index = 0;
    do {
      pDVar5 = Descriptor::nested_type(pDVar5,index);
      ImmutableMessageGenerator((ImmutableMessageGenerator *)local_a0,pDVar5,this->context_);
      iVar3 = GenerateStaticVariableInitializers((ImmutableMessageGenerator *)local_a0,printer);
      iVar2 = iVar2 + iVar3;
      local_a0._0_8_ = &PTR__ImmutableMessageGenerator_00520050;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
      ~FieldGeneratorMap(&local_68);
      local_a0._0_8_ = &PTR__MessageGenerator_00520008;
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20240722::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                *)(local_a0 + 0x10));
      index = index + 1;
      pDVar5 = (this->super_MessageGenerator).descriptor_;
    } while (index < *(int *)(pDVar5 + 0x80));
  }
  absl::lts_20240722::container_internal::
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_c8);
  return iVar2;
}

Assistant:

int ImmutableMessageGenerator::GenerateStaticVariableInitializers(
    io::Printer* printer) {
  int bytecode_estimate = 0;
  absl::flat_hash_map<absl::string_view, std::string> vars;
  vars["identifier"] = UniqueFileScopeIdentifier(descriptor_);
  vars["index"] = absl::StrCat(descriptor_->index());
  vars["classname"] = name_resolver_->GetImmutableClassName(descriptor_);
  if (descriptor_->containing_type() != nullptr) {
    vars["parent"] = UniqueFileScopeIdentifier(descriptor_->containing_type());
  }

  // The descriptor for this type.
  if (descriptor_->containing_type() == nullptr) {
    printer->Print(vars,
                   "internal_$identifier$_descriptor =\n"
                   "  getDescriptor().getMessageTypes().get($index$);\n");
    bytecode_estimate += 30;
  } else {
    printer->Print(
        vars,
        "internal_$identifier$_descriptor =\n"
        "  internal_$parent$_descriptor.getNestedTypes().get($index$);\n");
    bytecode_estimate += 30;
  }

  // And the FieldAccessorTable.
  bytecode_estimate += GenerateFieldAccessorTableInitializer(printer);

  // Generate static member initializers for all nested types.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    // TODO:  Reuse MessageGenerator objects?
    bytecode_estimate +=
        ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
            .GenerateStaticVariableInitializers(printer);
  }
  return bytecode_estimate;
}